

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O2

void __thiscall
xmotion::
Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
::AddEdge(Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
          *this,shared_ptr<xmotion::StateExample> *sstate,shared_ptr<xmotion::StateExample> *dstate,
         double trans)

{
  Vertex *this_00;
  vertex_iterator vVar1;
  edge_iterator eVar2;
  ostream *poVar3;
  vertex_iterator src_vertex;
  vertex_iterator dst_vertex;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
  local_70;
  double local_68;
  __shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2> local_40;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
  local_30;
  
  local_68 = trans;
  std::__shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &sstate->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>);
  vVar1 = ObtainVertexFromVertexMap(this,(shared_ptr<xmotion::StateExample> *)&local_40);
  local_70._M_cur = (__node_type *)vVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  this_00 = *(Vertex **)
             ((long)vVar1.super_const_vertex_iterator.super_VertexMapTypeIterator.
                    super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
                    ._M_cur + 0x10);
  std::__shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,
             &dstate->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>);
  eVar2 = Vertex::FindEdge<std::shared_ptr<xmotion::StateExample>,_nullptr>
                    (this_00,(shared_ptr<xmotion::StateExample> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  if (eVar2._M_node ==
      (_List_node_base *)
      (*(long *)((long)vVar1.super_const_vertex_iterator.super_VertexMapTypeIterator.
                       super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
                       ._M_cur + 0x10) + 0x20)) {
    std::__shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,
               &dstate->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>);
    vVar1 = ObtainVertexFromVertexMap(this,(shared_ptr<xmotion::StateExample> *)&local_60);
    local_30._M_cur = (__node_type *)vVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    std::__cxx11::
    list<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::vertex_iterator,_std::allocator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::vertex_iterator>_>
    ::push_back((list<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::vertex_iterator,_std::allocator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::vertex_iterator>_>
                 *)(*(long *)((long)vVar1.super_const_vertex_iterator.super_VertexMapTypeIterator.
                                    super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
                                    ._M_cur + 0x10) + 0x38),(value_type *)&local_70);
    std::__cxx11::
    list<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Edge,std::allocator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Edge>>
    ::
    emplace_back<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::vertex_iterator&,xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::vertex_iterator&,double&>
              ((list<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Edge,std::allocator<xmotion::Graph<std::shared_ptr<xmotion::StateExample>,double,xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>>>::Edge>>
                *)(*(long *)((long)&((local_70._M_cur)->
                                    super__Hash_node_value<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>
                                    ._M_storage._M_storage + 8) + 0x20),(vertex_iterator *)&local_70
               ,(vertex_iterator *)&local_30,&local_68);
  }
  else {
    eVar2._M_node[2]._M_next = (_List_node_base *)trans;
    std::operator<<((ostream *)&std::cout,"updated cost: ");
    poVar3 = std::ostream::_M_insert<double>(trans);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void Graph<State, Transition, StateIndexer>::AddEdge(State sstate, State dstate,
                                                     Transition trans) {
  auto src_vertex = ObtainVertexFromVertexMap(sstate);

  // update transition if edge already exists
  auto it = src_vertex->FindEdge(dstate);
  if (it != src_vertex->edge_end()) {
    it->cost = trans;
    std::cout << "updated cost: " << trans << std::endl;
    return;
  }

  // otherwise add new edge
  auto dst_vertex = ObtainVertexFromVertexMap(dstate);
  dst_vertex->vertices_from.push_back(src_vertex);
  src_vertex->edges_to.emplace_back(src_vertex, dst_vertex, trans);
}